

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O0

int sanity_assert_no_sockfd_traces(lws_context *context,lws_sockfd_type sfd)

{
  lws **pplVar1;
  bool bVar2;
  lws **done;
  lws **p;
  lws_sockfd_type sfd_local;
  lws_context *context_local;
  
  if ((sfd != -1) && (context->lws_lookup != (lws **)0x0)) {
    if (((*(ushort *)&context->field_0x7b7 >> 10 & 1) == 0) &&
       (context->lws_lookup[sfd] != (lws *)0x0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                    ,0x62,
                    "int sanity_assert_no_sockfd_traces(const struct lws_context *, lws_sockfd_type)"
                   );
    }
    done = context->lws_lookup;
    pplVar1 = done + context->max_fds;
    while( true ) {
      bVar2 = false;
      if ((done != pplVar1) && (bVar2 = true, *done != (lws *)0x0)) {
        bVar2 = ((*done)->desc).sockfd != sfd;
      }
      if (!bVar2) break;
      done = done + 1;
    }
    if (done != pplVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                    ,0x73,
                    "int sanity_assert_no_sockfd_traces(const struct lws_context *, lws_sockfd_type)"
                   );
    }
  }
  return 0;
}

Assistant:

int
sanity_assert_no_sockfd_traces(const struct lws_context *context,
			       lws_sockfd_type sfd)
{
#if LWS_MAX_SMP > 1
	/*
	 * We can't really do this test... another thread can accept and
	 * reuse the closed fd
	 */
	return 0;
#else
	struct lws **p, **done;

	if (sfd == LWS_SOCK_INVALID || !context->lws_lookup)
		return 0;

	if (!context->max_fds_unrelated_to_ulimit &&
	    context->lws_lookup[sfd - lws_plat_socket_offset()]) {
		assert(0); /* the fd is still in use */
		return 1;
	}

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* confirm the sfd not already in use */

	while (p != done && (!*p || (*p)->desc.sockfd != sfd))
		p++;

	if (p == done)
		return 0;

	assert(0); /* this fd is still in the tables */

	return 1;
#endif
}